

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

Matrix<float,_2,_2> __thiscall
deqp::gles3::Functional::MatrixCaseUtils::inverse<2>(MatrixCaseUtils *this,Matrix<float,_2,_2> *mat)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Matrix<float,_2,_2> MVar4;
  
  MVar4.m_data.m_data[1].m_data[0] =
       (mat->m_data).m_data[0].m_data[0] * (mat->m_data).m_data[1].m_data[1] -
       (mat->m_data).m_data[1].m_data[0] * (mat->m_data).m_data[0].m_data[1];
  tcu::Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  uVar1 = *(undefined8 *)((mat->m_data).m_data[0].m_data + 1);
  auVar2._0_8_ = CONCAT44((int)uVar1,(mat->m_data).m_data[1].m_data[1]) ^ 0x8000000000000000;
  auVar2._8_4_ = (uint)((ulong)uVar1 >> 0x20) ^ 0x80000000;
  auVar2._12_4_ = (mat->m_data).m_data[0].m_data[0];
  auVar3._4_4_ = MVar4.m_data.m_data[1].m_data[0];
  auVar3._0_4_ = MVar4.m_data.m_data[1].m_data[0];
  auVar3._8_4_ = MVar4.m_data.m_data[1].m_data[0];
  auVar3._12_4_ = MVar4.m_data.m_data[1].m_data[0];
  auVar3 = divps(auVar2,auVar3);
  *(undefined1 (*) [16])this = auVar3;
  MVar4.m_data.m_data[0].m_data = auVar3._0_8_;
  MVar4.m_data.m_data[1].m_data[1] = MVar4.m_data.m_data[1].m_data[0];
  return (Matrix<float,_2,_2>)MVar4.m_data.m_data;
}

Assistant:

tcu::Matrix<float, 2, 2> inverse<2> (const tcu::Matrix<float, 2, 2>& mat)
{
	const float					det		= determinant(mat);
	tcu::Matrix<float, 2, 2>	retVal;

	DE_ASSERT(det != 0.0f);

	retVal(0, 0) =  mat(1, 1) / det;
	retVal(0, 1) = -mat(0, 1) / det;
	retVal(1, 0) = -mat(1, 0) / det;
	retVal(1, 1) =  mat(0, 0) / det;

	return retVal;
}